

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

int __thiscall CVmHandleManager::alloc_handle(CVmHandleManager *this,void *item)

{
  size_t sVar1;
  void **ppvVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar1 = this->handles_max_;
  if (sVar1 == 0) {
    sVar5 = 0;
  }
  else {
    sVar4 = 0;
    do {
      sVar5 = sVar4;
      if (this->handles_[sVar4] == (void *)0x0) break;
      sVar4 = sVar4 + 1;
      sVar5 = sVar1;
    } while (sVar1 != sVar4);
  }
  if (sVar5 == sVar1) {
    this->handles_max_ = sVar1 + 0x20;
    ppvVar2 = (void **)realloc(this->handles_,sVar1 * 8 + 0x100);
    this->handles_ = ppvVar2;
    uVar3 = sVar5;
    if (sVar5 < this->handles_max_) {
      do {
        this->handles_[uVar3] = (void *)0x0;
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->handles_max_);
    }
  }
  this->handles_[sVar5] = item;
  return (int)sVar5 + 1;
}

Assistant:

int CVmHandleManager::alloc_handle(void *item)
{
    size_t slot;

    /* scan for a free slot */
    for (slot = 0 ; slot < handles_max_ ; ++slot)
    {
        /* if this one is free, use it */
        if (handles_[slot] == 0)
            break;
    }

    /* if we didn't find a free slot, extend the array */
    if (slot == handles_max_)
    {
        size_t i;

        /* allocate a larger array */
        handles_max_ += 32;
        handles_ = (void **)
                   t3realloc(handles_, handles_max_ * sizeof(*handles_));

        /* clear out the newly-allocated slots */
        for (i = slot ; i < handles_max_ ; ++i)
            handles_[i] = 0;
    }

    /* store the new item in our pointer array */
    handles_[slot] = item;

    /* 
     *   convert the slot number to a handle by adjusting it to a 1-based
     *   index, and return the result 
     */
    return slot + 1;
}